

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O0

Mat_<double> *
MagnitudeSpectrogram
          (Mat_<double> *__return_storage_ptr__,Mat_<float> *emphasis_data,int n_fft,int hop_length,
          int win_length)

{
  undefined4 uVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  float *pfVar5;
  void *__child_stack;
  void *__arg;
  double dVar6;
  _OutputArray local_7d8;
  undefined1 local_7b9;
  _OutputArray local_7b8;
  _InputArray local_7a0;
  undefined1 local_788 [8];
  Mat_<float> cv_mag;
  Mat local_710 [352];
  _InputArray local_5b0;
  undefined1 local_598 [8];
  Mat_<float> cv_feature;
  _InputArray local_520;
  _OutputArray local_508;
  _InputArray local_4f0;
  undefined1 local_4d8 [8];
  Mat_<float> Xif;
  Mat_<float> Xrf;
  _InputArray local_400 [14];
  Mat_<float> local_2a0;
  undefined1 local_240 [8];
  Mat_<float> framef;
  int i;
  AudioFFT fft;
  undefined1 local_1c8 [8];
  Mat_<float> feature_vector;
  int number_coefficients;
  int number_feature_vectors;
  int size;
  int k;
  float local_14c;
  int insert_cnt;
  Scalar_<double> local_e8;
  _OutputArray local_c8;
  _InputArray local_a0;
  undefined1 local_88 [8];
  Mat_<float> cv_padbuffer;
  int pad_lenght;
  int win_length_local;
  int hop_length_local;
  int n_fft_local;
  Mat_<float> *emphasis_data_local;
  Mat_<double> *mag;
  
  cv_padbuffer._92_4_ = win_length;
  if (win_length == 0) {
    cv_padbuffer._92_4_ = n_fft;
  }
  pad_lenght = hop_length;
  if (hop_length == 0) {
    pad_lenght = (int)cv_padbuffer._92_4_ / 4;
  }
  cv_padbuffer._88_4_ = n_fft / 2;
  cv::Mat_<float>::Mat_((Mat_<float> *)local_88);
  cv::_InputArray::_InputArray<float>(&local_a0,emphasis_data);
  cv::_OutputArray::_OutputArray<float>(&local_c8,(Mat_<float> *)local_88);
  uVar1 = cv_padbuffer._88_4_;
  cv::Scalar_<double>::Scalar_(&local_e8);
  cv::copyMakeBorder(&local_a0,&local_c8,0,0,uVar1,uVar1,4,(Scalar_ *)&local_e8);
  cv::_OutputArray::~_OutputArray(&local_c8);
  cv::_InputArray::~_InputArray(&local_a0);
  bVar2 = cv::Mat::empty();
  if ((bVar2 & 1) != 0) {
    local_14c = 0.0;
    cv::Mat_<float>::Mat_((Mat_<float> *)&insert_cnt,1,n_fft,&local_14c);
    cv::Mat_<float>::operator=(&hannWindow,(Mat_<float> *)&insert_cnt);
    cv::Mat_<float>::~Mat_((Mat_<float> *)&insert_cnt);
    if (n_fft <= (int)cv_padbuffer._92_4_) {
      poVar4 = std::operator<<((ostream *)&std::cout,"\tn_fft:");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,n_fft);
      poVar4 = std::operator<<(poVar4," > win_length:");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,n_fft);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      cv::Mat_<double>::Mat_(__return_storage_ptr__,0,0);
      goto LAB_00105d21;
    }
    iVar3 = n_fft - cv_padbuffer._92_4_;
    for (number_feature_vectors = 1; number_feature_vectors <= (int)cv_padbuffer._92_4_;
        number_feature_vectors = number_feature_vectors + 1) {
      dVar6 = cos(((pi + pi) * (double)number_feature_vectors) / (double)(cv_padbuffer._92_4_ + 1));
      pfVar5 = cv::Mat_<float>::operator()(&hannWindow,0,number_feature_vectors + -1 + iVar3 / 2);
      *pfVar5 = (float)((1.0 - dVar6) * 0.5);
    }
  }
  feature_vector._92_4_ = n_fft / 2 + 1;
  fft._impl._M_t.
  super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
  .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl._4_4_ = 0;
  cv::Mat_<float>::Mat_
            ((Mat_<float> *)local_1c8,
             (cv_padbuffer._0_4_ * cv_padbuffer._4_4_ - n_fft) / pad_lenght + 1,
             feature_vector._92_4_,
             (float *)((long)&fft._impl._M_t.
                              super___uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
                              .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false> + 4));
  audiofft::AudioFFT::AudioFFT((AudioFFT *)&stack0xfffffffffffffe28);
  audiofft::AudioFFT::init((AudioFFT *)&stack0xfffffffffffffe28,(EVP_PKEY_CTX *)(long)n_fft);
  for (framef._92_4_ = 0; (int)framef._92_4_ <= cv_padbuffer._0_4_ * cv_padbuffer._4_4_ - n_fft;
      framef._92_4_ = pad_lenght + framef._92_4_) {
    pfVar5 = (float *)(cv_padbuffer._8_8_ + (long)(int)framef._92_4_ * 4);
    __arg = (void *)0x0;
    cv::Mat_<float>::Mat_(&local_2a0,1,n_fft,pfVar5,0);
    cv::Mat_<float>::clone
              ((Mat_<float> *)local_240,(__fn *)&local_2a0,__child_stack,(int)pfVar5,__arg);
    cv::Mat_<float>::~Mat_(&local_2a0);
    cv::_InputArray::_InputArray<float>((_InputArray *)&Xrf.field_0x58,&hannWindow);
    cv::Mat::mul(local_400,1.0);
    cv::Mat_<float>::operator=((Mat_<float> *)local_240,(MatExpr *)local_400);
    cv::MatExpr::~MatExpr((MatExpr *)local_400);
    cv::_InputArray::~_InputArray((_InputArray *)&Xrf.field_0x58);
    cv::Mat_<float>::Mat_((Mat_<float> *)&Xif.field_0x58,1,feature_vector._92_4_);
    cv::Mat_<float>::Mat_((Mat_<float> *)local_4d8,1,feature_vector._92_4_);
    audiofft::AudioFFT::fft
              ((AudioFFT *)&stack0xfffffffffffffe28,(float *)framef._8_8_,(float *)Xrf._8_8_,
               (float *)Xif._8_8_);
    cv::_InputArray::_InputArray<float>(&local_4f0,(Mat_<float> *)&Xif.field_0x58);
    cv::_OutputArray::_OutputArray<float>(&local_508,(Mat_<float> *)&Xif.field_0x58);
    cv::pow(&local_4f0,2.0,&local_508);
    cv::_OutputArray::~_OutputArray(&local_508);
    cv::_InputArray::~_InputArray(&local_4f0);
    cv::_InputArray::_InputArray<float>(&local_520,(Mat_<float> *)local_4d8);
    cv::_OutputArray::_OutputArray<float>
              ((_OutputArray *)&cv_feature.field_0x58,(Mat_<float> *)local_4d8);
    cv::pow(&local_520,2.0,(_OutputArray *)&cv_feature.field_0x58);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&cv_feature.field_0x58);
    cv::_InputArray::~_InputArray(&local_520);
    uVar1 = feature_vector._92_4_;
    pfVar5 = cv::Mat_<float>::operator[]((Mat_<float> *)local_1c8,(int)framef._92_4_ / pad_lenght);
    cv::Mat_<float>::Mat_((Mat_<float> *)local_598,1,uVar1,pfVar5,0);
    cv::operator+(local_710,(Mat *)&Xif.field_0x58);
    cv::_InputArray::_InputArray(&local_5b0,(MatExpr *)local_710);
    cv::_OutputArray::_OutputArray<float>
              ((_OutputArray *)&cv_mag.field_0x58,(Mat_<float> *)local_598);
    cv::sqrt(&local_5b0,(_OutputArray *)&cv_mag.field_0x58);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&cv_mag.field_0x58);
    cv::_InputArray::~_InputArray(&local_5b0);
    cv::MatExpr::~MatExpr((MatExpr *)local_710);
    cv::Mat_<float>::~Mat_((Mat_<float> *)local_598);
    cv::Mat_<float>::~Mat_((Mat_<float> *)local_4d8);
    cv::Mat_<float>::~Mat_((Mat_<float> *)&Xif.field_0x58);
    cv::Mat_<float>::~Mat_((Mat_<float> *)local_240);
  }
  cv::Mat_<float>::Mat_((Mat_<float> *)local_788);
  cv::_InputArray::_InputArray<float>(&local_7a0,(Mat_<float> *)local_1c8);
  cv::_OutputArray::_OutputArray<float>(&local_7b8,(Mat_<float> *)local_788);
  cv::transpose(&local_7a0,&local_7b8);
  cv::_OutputArray::~_OutputArray(&local_7b8);
  cv::_InputArray::~_InputArray(&local_7a0);
  local_7b9 = 0;
  cv::Mat_<double>::Mat_(__return_storage_ptr__);
  cv::_OutputArray::_OutputArray<double>(&local_7d8,__return_storage_ptr__);
  cv::Mat::convertTo((_OutputArray *)local_788,(int)&local_7d8,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_7d8);
  local_7b9 = 1;
  cv::Mat_<float>::~Mat_((Mat_<float> *)local_788);
  audiofft::AudioFFT::~AudioFFT((AudioFFT *)&stack0xfffffffffffffe28);
  cv::Mat_<float>::~Mat_((Mat_<float> *)local_1c8);
LAB_00105d21:
  cv::Mat_<float>::~Mat_((Mat_<float> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> MagnitudeSpectrogram(const cv::Mat_<float> *emphasis_data, int n_fft = 2048, int hop_length = 0,
                                      int win_length = 0) {
    if (win_length == 0) {
        win_length = n_fft;
    }
    if (hop_length == 0) {
        hop_length = win_length / 4;
    }

    // reflect对称填充
    int pad_lenght = n_fft / 2;
    // 使用opencv里的copyMakeBorder来完成reflect填充
    cv::Mat_<float> cv_padbuffer;
    cv::copyMakeBorder(*emphasis_data, cv_padbuffer, 0, 0, pad_lenght, pad_lenght, cv::BORDER_REFLECT_101);

    // windowing加窗：将每一帧乘以汉宁窗，以增加帧左端和右端的连续性。
    // 生成一个1600长度的hannWindow，并居中到2048长度的
    if (hannWindow.empty()) {
        hannWindow = cv::Mat_<float>(1, n_fft, 0.0f);
        int insert_cnt = 0;
        if (n_fft > win_length) {
            insert_cnt = (n_fft - win_length) / 2;
        } else {
            std::cout << "\tn_fft:" << n_fft << " > win_length:" << n_fft << std::endl;
            return cv::Mat_<double>(0, 0);
        }
        for (int k = 1; k <= win_length; k++) {
            hannWindow(0, k - 1 + insert_cnt) = float(0.5 * (1 - cos(2 * pi * k / (win_length + 1))));
        }
    }
    // opencv虽然有Hann窗生成函数，但是必须要求width > 1，height > 1
    //cv::Mat_<double> cv_hannWindow;
    //cv::createHanningWindow(cv_hannWindow, cv::Size(1, win_length), CV_64FC1);

    int size = cv_padbuffer.rows * cv_padbuffer.cols;//padbuffer.size()
    int number_feature_vectors = (size - n_fft) / hop_length + 1;
    int number_coefficients = n_fft / 2 + 1;
    cv::Mat_<float> feature_vector(number_feature_vectors, number_coefficients, 0.0f);

    audiofft::AudioFFT fft; //将FFT初始化放在循环外，可达到最优速度
    fft.init(size_t(n_fft));
    for (int i = 0; i <= size - n_fft; i += hop_length) {
        // 每次取一段数据
        cv::Mat_<float> framef = cv::Mat_<float>(1, n_fft, (float *) (cv_padbuffer.data) + i).clone();
        // 加hann窗
        framef = framef.mul(hannWindow);

        // 复数：Xrf实数，Xif虚数。
        cv::Mat_<float> Xrf(1, number_coefficients);
        cv::Mat_<float> Xif(1, number_coefficients);
        fft.fft((float *) (framef.data), (float *) (Xrf.data), (float *) (Xif.data));

        // 求模
        cv::pow(Xrf, 2, Xrf);
        cv::pow(Xif, 2, Xif);
        cv::Mat_<float> cv_feature(1, number_coefficients, &(feature_vector[i / hop_length][0]));
        cv::sqrt(Xrf + Xif, cv_feature);
    }
    cv::Mat_<float> cv_mag;
    cv::transpose(feature_vector, cv_mag);
    cv::Mat_<double> mag;
    cv_mag.convertTo(mag, CV_64FC1);

    return mag;
}